

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystem.cpp
# Opt level: O1

void __thiscall
solitaire::graphics::SDLGraphicsSystem::createWindow
          (SDLGraphicsSystem *this,string *title,uint width,uint height)

{
  UniquePtr<SDL_Window> *this_00;
  _Head_base<0UL,_SDL_Renderer_*,_false> _Var1;
  runtime_error *this_01;
  UniquePtr<SDL_Renderer> UStack_58;
  
  if (this->isWindowCreated != true) {
    initializeSDLOrQuitAndThrowError(this);
    createSDLWindowOrQuitAndThrowError((UniquePtr<SDL_Window> *)&UStack_58,this,title,width,height);
    _Var1._M_head_impl =
         UStack_58._M_t.super___uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>.
         _M_t.super__Tuple_impl<0UL,_SDL_Renderer_*,_std::function<void_(SDL_Renderer_*)>_>.
         super__Head_base<0UL,_SDL_Renderer_*,_false>._M_head_impl;
    this_00 = &this->window;
    UStack_58._M_t.super___uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>._M_t.
    super__Tuple_impl<0UL,_SDL_Renderer_*,_std::function<void_(SDL_Renderer_*)>_>.
    super__Head_base<0UL,_SDL_Renderer_*,_false>._M_head_impl = (pointer)0x0;
    std::__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_>::reset
              ((__uniq_ptr_impl<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)this_00,
               (pointer)_Var1._M_head_impl);
    std::function<void_(SDL_Window_*)>::operator=
              ((function<void_(SDL_Window_*)> *)this_00,(function<void_(SDL_Window_*)> *)&UStack_58)
    ;
    std::unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_>::~unique_ptr
              ((unique_ptr<SDL_Window,_std::function<void_(SDL_Window_*)>_> *)&UStack_58);
    createSDLWindowRendererOrQuitAndThrowError(&UStack_58,this,this_00);
    _Var1._M_head_impl =
         UStack_58._M_t.super___uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>.
         _M_t.super__Tuple_impl<0UL,_SDL_Renderer_*,_std::function<void_(SDL_Renderer_*)>_>.
         super__Head_base<0UL,_SDL_Renderer_*,_false>._M_head_impl;
    UStack_58._M_t.super___uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>._M_t.
    super__Tuple_impl<0UL,_SDL_Renderer_*,_std::function<void_(SDL_Renderer_*)>_>.
    super__Head_base<0UL,_SDL_Renderer_*,_false>._M_head_impl = (SDL_Renderer *)0x0;
    std::__uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::reset
              ((__uniq_ptr_impl<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_> *)
               &this->renderer,_Var1._M_head_impl);
    std::function<void_(SDL_Renderer_*)>::operator=
              ((function<void_(SDL_Renderer_*)> *)&this->renderer,
               (function<void_(SDL_Renderer_*)> *)&UStack_58);
    std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>::~unique_ptr(&UStack_58);
    this->isWindowCreated = true;
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Window already created");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SDLGraphicsSystem::createWindow(
    const std::string& title, const unsigned width, const unsigned height)
{
    if (isWindowCreated)
        throw std::runtime_error {"Window already created"};

    initializeSDLOrQuitAndThrowError();
    window = createSDLWindowOrQuitAndThrowError(title, width, height);
    renderer = createSDLWindowRendererOrQuitAndThrowError(window);
    isWindowCreated = true;
}